

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLReader::XMLReader
          (XMLReader *this,XMLCh *pubId,XMLCh *sysId,BinInputStream *streamToAdopt,
          Encodings encodingEnum,RefFrom from,Types type,Sources source,bool throwAtEnd,
          bool calculateSrcOfs,XMLSize_t lowWaterMark,XMLVersion version,MemoryManager *manager)

{
  XMLSize_t XVar1;
  undefined1 uVar2;
  int iVar3;
  XMLCh *pXVar4;
  XMLTranscoder *pXVar5;
  TranscodingException *this_00;
  XMLByte *pXVar6;
  Codes failReason;
  ArrayJanitor<char16_t> jan;
  
  this->fCharIndex = 0;
  this->fCharsAvail = 0;
  this->fCurCol = 1;
  this->fCurLine = 1;
  this->fEncoding = UTF_8;
  this->fEncodingStr = (XMLCh *)0x0;
  this->fForcedEncoding = true;
  this->fNoMore = false;
  pXVar4 = XMLString::replicate(pubId,manager);
  this->fPublicId = pXVar4;
  this->fRawBufIndex = 0;
  this->fRawBytesAvail = 0;
  this->fLowWaterMark = lowWaterMark;
  this->fReaderNum = 0xffffffff;
  this->fRefFrom = from;
  this->fSentTrailingSpace = false;
  this->fSource = source;
  this->fSrcOfsBase = 0;
  this->fSrcOfsSupported = false;
  this->fCalculateSrcOfs = calculateSrcOfs;
  pXVar4 = XMLString::replicate(sysId,manager);
  this->fSystemId = pXVar4;
  this->fStream = streamToAdopt;
  this->fSwapped = false;
  this->fThrowAtEnd = throwAtEnd;
  this->fTranscoder = (XMLTranscoder *)0x0;
  this->fType = type;
  this->fMemoryManager = manager;
  this->fXMLVersion = version;
  pXVar6 = &XMLChar1_0::fgCharCharsTable1_0;
  uVar2 = XMLChar1_0::enableNEL;
  if (version == XMLV1_1) {
    pXVar6 = &XMLChar1_1::fgCharCharsTable1_1;
    uVar2 = true;
  }
  this->fNEL = (bool)uVar2;
  this->fgCharCharsTable = pXVar6;
  refreshRawBuffer(this);
  iVar3 = (*XMLPlatformUtils::fgTransService->_vptr_XMLTransService[6])();
  this->fSrcOfsSupported = SUB41(iVar3,0);
  this->fEncoding = encodingEnum;
  pXVar4 = XMLRecognizer::nameForEncoding(encodingEnum,this->fMemoryManager);
  pXVar4 = XMLString::replicate(pXVar4,this->fMemoryManager);
  this->fEncodingStr = pXVar4;
  checkForSwapped(this);
  pXVar5 = XMLTransService::makeNewTranscoderFor
                     (XMLPlatformUtils::fgTransService,this->fEncoding,&failReason,0x4000,
                      this->fMemoryManager);
  this->fTranscoder = pXVar5;
  if (pXVar5 == (XMLTranscoder *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fSystemId);
    ArrayJanitor<char16_t>::ArrayJanitor(&jan,this->fEncodingStr,this->fMemoryManager);
    this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
    TranscodingException::TranscodingException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
               ,0x1cc,Trans_CantCreateCvtrFor,this->fEncodingStr,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
  }
  if ((this->fType == Type_PE) && (this->fRefFrom == RefFrom_NonLiteral)) {
    this->fCharSizeBuf[this->fCharsAvail] = '\0';
    XVar1 = this->fCharsAvail;
    this->fCharOfsBuf[XVar1] = 0;
    this->fCharsAvail = XVar1 + 1;
    this->fCharBuf[XVar1] = L' ';
  }
  return;
}

Assistant:

XMLReader::XMLReader(const  XMLCh* const          pubId
                    , const XMLCh* const          sysId
                    ,       BinInputStream* const streamToAdopt
                    , XMLRecognizer::Encodings    encodingEnum
                    , const RefFrom               from
                    , const Types                 type
                    , const Sources               source
                    , const bool                  throwAtEnd
                    , const bool                  calculateSrcOfs
                    ,       XMLSize_t             lowWaterMark
                    , const XMLVersion            version
                    ,       MemoryManager* const  manager) :
    fCharIndex(0)
    , fCharsAvail(0)
    , fCurCol(1)
    , fCurLine(1)
    , fEncoding(XMLRecognizer::UTF_8)
    , fEncodingStr(0)
    , fForcedEncoding(true)
    , fNoMore(false)
    , fPublicId(XMLString::replicate(pubId, manager))
    , fRawBufIndex(0)
    , fRawBytesAvail(0)
    , fLowWaterMark (lowWaterMark)
    , fReaderNum(0xFFFFFFFF)
    , fRefFrom(from)
    , fSentTrailingSpace(false)
    , fSource(source)
    , fSrcOfsBase(0)
    , fSrcOfsSupported(false)
    , fCalculateSrcOfs(calculateSrcOfs)
    , fSystemId(XMLString::replicate(sysId, manager))
    , fStream(streamToAdopt)
    , fSwapped(false)
    , fThrowAtEnd(throwAtEnd)
    , fTranscoder(0)
    , fType(type)
    , fMemoryManager(manager)
{
    setXMLVersion(version);

    try
    {
        // Do an initial load of raw bytes
        refreshRawBuffer();
    }
    catch (const XMLPlatformUtilsException&)
    {
        cleanup();
        throw;
    }

    // Ask the transcoding service if it supports src offset info
    fSrcOfsSupported = XMLPlatformUtils::fgTransService->supportsSrcOfs();

    //
    //  Use the passed encoding code
    //
    fEncoding = encodingEnum;
    fEncodingStr = XMLString::replicate(XMLRecognizer::nameForEncoding(fEncoding, fMemoryManager), fMemoryManager);

    // Check whether the fSwapped flag should be set or not
    checkForSwapped();

    //
    //  Create a transcoder for the encoding. Since the encoding has been
    //  forced, this will be the one we will use, period.
    //
    XMLTransService::Codes failReason;
    fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
    (
        fEncoding
        , failReason
        , kCharBufSize
        , fMemoryManager
    );

    if (!fTranscoder)
    {
        // We are about to throw which means the d-tor won't be called.
        // Clean up some memory.
        //
        fMemoryManager->deallocate(fPublicId);
        fMemoryManager->deallocate(fSystemId);
        ArrayJanitor<XMLCh> jan (fEncodingStr, fMemoryManager);

        ThrowXMLwithMemMgr1
        (
            TranscodingException
            , XMLExcepts::Trans_CantCreateCvtrFor
            , fEncodingStr
            , fMemoryManager
        );
    }

    //
    //  Note that, unlike above, we do not do an initial decode of the
    //  first line. We take the caller's word that the encoding is correct
    //  and just assume that the first bulk decode (kicked off by the first
    //  get of a character) will work.
    //
    //  So we do here the slipping in of the leading space if required.
    //
    if ((fType == Type_PE) && (fRefFrom == RefFrom_NonLiteral))
    {
        // This represents no data from the source
        fCharSizeBuf[fCharsAvail] = 0;
        fCharOfsBuf[fCharsAvail] = 0;
        fCharBuf[fCharsAvail++] = chSpace;
    }
}